

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary-reader-ir.cc
# Opt level: O1

Result __thiscall
wabt::anon_unknown_78::BinaryReaderIR::TopLabelExpr
          (BinaryReaderIR *this,LabelNode **label,Expr **expr)

{
  pointer pLVar1;
  pointer pLVar2;
  long lVar3;
  Enum EVar4;
  ulong uVar5;
  
  pLVar1 = (this->label_stack_).
           super__Vector_base<wabt::(anonymous_namespace)::LabelNode,_std::allocator<wabt::(anonymous_namespace)::LabelNode>_>
           ._M_impl.super__Vector_impl_data._M_start;
  pLVar2 = (this->label_stack_).
           super__Vector_base<wabt::(anonymous_namespace)::LabelNode,_std::allocator<wabt::(anonymous_namespace)::LabelNode>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  lVar3 = (long)pLVar2 - (long)pLVar1;
  if (lVar3 == 0) {
    PrintError(this,"accessing stack depth: %u >= max: %zd",0,0);
  }
  else {
    *label = (LabelNode *)((long)pLVar1 + lVar3 + -0x18);
  }
  EVar4 = Error;
  if (pLVar2 != pLVar1) {
    pLVar1 = (this->label_stack_).
             super__Vector_base<wabt::(anonymous_namespace)::LabelNode,_std::allocator<wabt::(anonymous_namespace)::LabelNode>_>
             ._M_impl.super__Vector_impl_data._M_start;
    lVar3 = (long)(this->label_stack_).
                  super__Vector_base<wabt::(anonymous_namespace)::LabelNode,_std::allocator<wabt::(anonymous_namespace)::LabelNode>_>
                  ._M_impl.super__Vector_impl_data._M_finish - (long)pLVar1;
    uVar5 = (lVar3 >> 3) * -0x5555555555555555;
    if (uVar5 < 2) {
      PrintError(this,"accessing stack depth: %u >= max: %zd",1,uVar5);
    }
    else {
      lVar3 = *(long *)((long)pLVar1 + lVar3 + -0x28);
      if (*(long *)(lVar3 + 0x10) == 0) {
        __assert_fail("!empty()",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]wabt/src/intrusive-list.h"
                      ,0x192,
                      "typename intrusive_list<T>::reference wabt::intrusive_list<wabt::Expr>::back() [T = wabt::Expr]"
                     );
      }
      *expr = *(Expr **)(lVar3 + 8);
      EVar4 = Ok;
    }
  }
  return (Result)EVar4;
}

Assistant:

Result BinaryReaderIR::TopLabelExpr(LabelNode** label, Expr** expr) {
  CHECK_RESULT(TopLabel(label));
  LabelNode* parent_label;
  CHECK_RESULT(GetLabelAt(&parent_label, 1));
  *expr = &parent_label->exprs->back();
  return Result::Ok;
}